

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::ReadTOC(CrateReader *this)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  uint64_t uVar6;
  ostream *poVar7;
  reference pvVar8;
  unsigned_long *in_R8;
  string local_13a8;
  allocator local_1381;
  string local_1380;
  string local_1360;
  ostringstream local_1340 [8];
  ostringstream ss_e_10;
  size_t end_offset;
  allocator local_1199;
  string local_1198;
  string local_1178;
  ostringstream local_1158 [8];
  ostringstream ss_e_9;
  string local_fe0;
  allocator local_fb9;
  string local_fb8;
  string local_f98;
  ostringstream local_f78 [8];
  ostringstream ss_e_8;
  string local_e00;
  allocator local_dd9;
  string local_dd8;
  string local_db8;
  ostringstream local_d98 [8];
  ostringstream ss_e_7;
  string local_c20;
  allocator local_bf9;
  string local_bf8;
  string local_bd8;
  ostringstream local_bb8 [8];
  ostringstream ss_e_6;
  string local_a40;
  __cxx11 local_a20 [32];
  string local_a00 [32];
  ostringstream local_9e0 [8];
  ostringstream ss_e_5;
  size_type local_868;
  size_t i;
  ostringstream local_840 [8];
  ostringstream ss_e_4;
  string local_6c8;
  allocator local_6a1;
  string local_6a0 [32];
  string local_680;
  ostringstream local_660 [8];
  ostringstream ss_e_3;
  string local_4e8;
  ostringstream local_4c8 [8];
  ostringstream ss_e_2;
  undefined1 local_350 [8];
  uint64_t num_sections;
  ostringstream local_328 [8];
  ostringstream ss_e_1;
  string local_1b0;
  ostringstream local_190 [8];
  ostringstream ss_e;
  CrateReader *this_local;
  
  if ((this->_toc_offset < 0x59) ||
     (lVar1 = this->_toc_offset, uVar6 = StreamReader::size(this->_sr), (long)uVar6 <= lVar1)) {
    ::std::__cxx11::ostringstream::ostringstream(local_190);
    poVar7 = ::std::operator<<((ostream *)local_190,"[error]");
    poVar7 = ::std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar7 = ::std::operator<<(poVar7,":");
    poVar7 = ::std::operator<<(poVar7,"ReadTOC");
    poVar7 = ::std::operator<<(poVar7,"():");
    poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1873);
    ::std::operator<<(poVar7," ");
    poVar7 = ::std::operator<<((ostream *)local_190,"Invalid toc offset.");
    ::std::operator<<(poVar7,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_1b0);
    ::std::__cxx11::string::~string((string *)&local_1b0);
    ::std::__cxx11::ostringstream::~ostringstream(local_190);
    this_local._7_1_ = false;
  }
  else {
    bVar4 = StreamReader::seek_set(this->_sr,this->_toc_offset);
    if (bVar4) {
      local_350 = (undefined1  [8])0x0;
      bVar4 = StreamReader::read8(this->_sr,(uint64_t *)local_350);
      if (bVar4) {
        if ((ulong)local_350 < (this->_config).maxTOCSections) {
          ::std::vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::resize
                    (&(this->_toc).sections,(size_type)local_350);
          this->_memoryUsage = (long)local_350 * 0x20 + this->_memoryUsage;
          if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
            ::std::__cxx11::ostringstream::ostringstream(local_840);
            poVar7 = ::std::operator<<((ostream *)local_840,"[error]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,"[Crate]");
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReadTOC");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x188a);
            ::std::operator<<(poVar7," ");
            poVar7 = ::std::operator<<((ostream *)local_840,"Reached to max memory budget.");
            ::std::operator<<(poVar7,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)&i);
            ::std::__cxx11::string::~string((string *)&i);
            this_local._7_1_ = false;
            ::std::__cxx11::ostringstream::~ostringstream(local_840);
          }
          else {
            for (local_868 = 0; local_868 < (ulong)local_350; local_868 = local_868 + 1) {
              pvVar8 = ::std::
                       vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::
                       operator[](&(this->_toc).sections,local_868);
              bVar4 = ReadSection(this,pvVar8);
              if (!bVar4) {
                ::std::__cxx11::ostringstream::ostringstream(local_9e0);
                poVar7 = ::std::operator<<((ostream *)local_9e0,"[error]");
                poVar7 = ::std::operator<<(poVar7,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar7 = ::std::operator<<(poVar7,":");
                poVar7 = ::std::operator<<(poVar7,"ReadTOC");
                poVar7 = ::std::operator<<(poVar7,"():");
                poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x188e);
                ::std::operator<<(poVar7," ");
                std::__cxx11::to_string(local_a20,local_868);
                ::std::operator+((char *)local_a00,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)"Failed to read TOC section at ");
                poVar7 = ::std::operator<<((ostream *)local_9e0,local_a00);
                ::std::operator<<(poVar7,"\n");
                ::std::__cxx11::string::~string(local_a00);
                ::std::__cxx11::string::~string((string *)local_a20);
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_a40);
                ::std::__cxx11::string::~string((string *)&local_a40);
                ::std::__cxx11::ostringstream::~ostringstream(local_9e0);
                return false;
              }
              pvVar8 = ::std::
                       vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::
                       operator[](&(this->_toc).sections,local_868);
              if (pvVar8->start < 0) {
                ::std::__cxx11::ostringstream::ostringstream(local_bb8);
                poVar7 = ::std::operator<<((ostream *)local_bb8,"[error]");
                poVar7 = ::std::operator<<(poVar7,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar7 = ::std::operator<<(poVar7,"[Crate]");
                poVar7 = ::std::operator<<(poVar7,":");
                poVar7 = ::std::operator<<(poVar7,"ReadTOC");
                poVar7 = ::std::operator<<(poVar7,"():");
                poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1896);
                ::std::operator<<(poVar7," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)&local_bf8,"Invalid section start byte offset.",&local_bf9);
                fmt::format(&local_bd8,&local_bf8);
                poVar7 = ::std::operator<<((ostream *)local_bb8,(string *)&local_bd8);
                ::std::operator<<(poVar7,"\n");
                ::std::__cxx11::string::~string((string *)&local_bd8);
                ::std::__cxx11::string::~string((string *)&local_bf8);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_bf9);
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_c20);
                ::std::__cxx11::string::~string((string *)&local_c20);
                ::std::__cxx11::ostringstream::~ostringstream(local_bb8);
                return false;
              }
              pvVar8 = ::std::
                       vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::
                       operator[](&(this->_toc).sections,local_868);
              if (pvVar8->size < 1) {
                ::std::__cxx11::ostringstream::ostringstream(local_d98);
                poVar7 = ::std::operator<<((ostream *)local_d98,"[error]");
                poVar7 = ::std::operator<<(poVar7,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar7 = ::std::operator<<(poVar7,"[Crate]");
                poVar7 = ::std::operator<<(poVar7,":");
                poVar7 = ::std::operator<<(poVar7,"ReadTOC");
                poVar7 = ::std::operator<<(poVar7,"():");
                poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x189a);
                ::std::operator<<(poVar7," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)&local_dd8,"Invalid or empty section size.",&local_dd9);
                fmt::format(&local_db8,&local_dd8);
                poVar7 = ::std::operator<<((ostream *)local_d98,(string *)&local_db8);
                ::std::operator<<(poVar7,"\n");
                ::std::__cxx11::string::~string((string *)&local_db8);
                ::std::__cxx11::string::~string((string *)&local_dd8);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_dd9);
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_e00);
                ::std::__cxx11::string::~string((string *)&local_e00);
                ::std::__cxx11::ostringstream::~ostringstream(local_d98);
                return false;
              }
              pvVar8 = ::std::
                       vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::
                       operator[](&(this->_toc).sections,local_868);
              uVar2 = pvVar8->size;
              uVar6 = StreamReader::size(this->_sr);
              if (uVar6 < uVar2) {
                ::std::__cxx11::ostringstream::ostringstream(local_f78);
                poVar7 = ::std::operator<<((ostream *)local_f78,"[error]");
                poVar7 = ::std::operator<<(poVar7,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar7 = ::std::operator<<(poVar7,"[Crate]");
                poVar7 = ::std::operator<<(poVar7,":");
                poVar7 = ::std::operator<<(poVar7,"ReadTOC");
                poVar7 = ::std::operator<<(poVar7,"():");
                poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x189e);
                ::std::operator<<(poVar7," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)&local_fb8,"Section size exceeds input USDC data size.",
                           &local_fb9);
                fmt::format(&local_f98,&local_fb8);
                poVar7 = ::std::operator<<((ostream *)local_f78,(string *)&local_f98);
                ::std::operator<<(poVar7,"\n");
                ::std::__cxx11::string::~string((string *)&local_f98);
                ::std::__cxx11::string::~string((string *)&local_fb8);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_fb9);
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_fe0);
                ::std::__cxx11::string::~string((string *)&local_fe0);
                ::std::__cxx11::ostringstream::~ostringstream(local_f78);
                return false;
              }
              pvVar8 = ::std::
                       vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::
                       operator[](&(this->_toc).sections,local_868);
              uVar2 = pvVar8->start;
              uVar6 = StreamReader::size(this->_sr);
              if (uVar6 < uVar2) {
                ::std::__cxx11::ostringstream::ostringstream(local_1158);
                poVar7 = ::std::operator<<((ostream *)local_1158,"[error]");
                poVar7 = ::std::operator<<(poVar7,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar7 = ::std::operator<<(poVar7,"[Crate]");
                poVar7 = ::std::operator<<(poVar7,":");
                poVar7 = ::std::operator<<(poVar7,"ReadTOC");
                poVar7 = ::std::operator<<(poVar7,"():");
                poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x18a2);
                ::std::operator<<(poVar7," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)&local_1198,
                           "Section start byte offset exceeds input USDC data size.",&local_1199);
                fmt::format(&local_1178,&local_1198);
                poVar7 = ::std::operator<<((ostream *)local_1158,(string *)&local_1178);
                ::std::operator<<(poVar7,"\n");
                ::std::__cxx11::string::~string((string *)&local_1178);
                ::std::__cxx11::string::~string((string *)&local_1198);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1199);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&end_offset);
                ::std::__cxx11::string::~string((string *)&end_offset);
                ::std::__cxx11::ostringstream::~ostringstream(local_1158);
                return false;
              }
              pvVar8 = ::std::
                       vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::
                       operator[](&(this->_toc).sections,local_868);
              lVar1 = pvVar8->start;
              pvVar8 = ::std::
                       vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::
                       operator[](&(this->_toc).sections,local_868);
              lVar3 = pvVar8->size;
              uVar6 = StreamReader::size(this->_sr);
              if (uVar6 < (ulong)(lVar1 + lVar3)) {
                ::std::__cxx11::ostringstream::ostringstream(local_1340);
                poVar7 = ::std::operator<<((ostream *)local_1340,"[error]");
                poVar7 = ::std::operator<<(poVar7,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar7 = ::std::operator<<(poVar7,"[Crate]");
                poVar7 = ::std::operator<<(poVar7,":");
                poVar7 = ::std::operator<<(poVar7,"ReadTOC");
                poVar7 = ::std::operator<<(poVar7,"():");
                poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x18ad);
                ::std::operator<<(poVar7," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)&local_1380,
                           "Section byte offset + size exceeds input USDC data size.",&local_1381);
                fmt::format(&local_1360,&local_1380);
                poVar7 = ::std::operator<<((ostream *)local_1340,(string *)&local_1360);
                ::std::operator<<(poVar7,"\n");
                ::std::__cxx11::string::~string((string *)&local_1360);
                ::std::__cxx11::string::~string((string *)&local_1380);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1381);
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_13a8);
                ::std::__cxx11::string::~string((string *)&local_13a8);
                ::std::__cxx11::ostringstream::~ostringstream(local_1340);
                return false;
              }
              pvVar8 = ::std::
                       vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::
                       operator[](&(this->_toc).sections,local_868);
              iVar5 = strncmp(pvVar8->name,"TOKENS",0xf);
              if (iVar5 == 0) {
                this->_tokens_index = local_868;
              }
              else {
                pvVar8 = ::std::
                         vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
                         ::operator[](&(this->_toc).sections,local_868);
                iVar5 = strncmp(pvVar8->name,"STRINGS",0xf);
                if (iVar5 == 0) {
                  this->_strings_index = local_868;
                }
                else {
                  pvVar8 = ::std::
                           vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
                           ::operator[](&(this->_toc).sections,local_868);
                  iVar5 = strncmp(pvVar8->name,"FIELDS",0xf);
                  if (iVar5 == 0) {
                    this->_fields_index = local_868;
                  }
                  else {
                    pvVar8 = ::std::
                             vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
                             ::operator[](&(this->_toc).sections,local_868);
                    iVar5 = strncmp(pvVar8->name,"FIELDSETS",0xf);
                    if (iVar5 == 0) {
                      this->_fieldsets_index = local_868;
                    }
                    else {
                      pvVar8 = ::std::
                               vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
                               ::operator[](&(this->_toc).sections,local_868);
                      iVar5 = strncmp(pvVar8->name,"SPECS",0xf);
                      if (iVar5 == 0) {
                        this->_specs_index = local_868;
                      }
                      else {
                        pvVar8 = ::std::
                                 vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
                                 ::operator[](&(this->_toc).sections,local_868);
                        iVar5 = strncmp(pvVar8->name,"PATHS",0xf);
                        if (iVar5 == 0) {
                          this->_paths_index = local_868;
                        }
                      }
                    }
                  }
                }
              }
            }
            this_local._7_1_ = true;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_660);
          poVar7 = ::std::operator<<((ostream *)local_660,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,"[Crate]");
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReadTOC");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1883);
          ::std::operator<<(poVar7," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_6a0,"# of sections {} are too large. maxTOCSections is set to {}",
                     &local_6a1);
          fmt::format<unsigned_long,unsigned_long>
                    (&local_680,(fmt *)local_6a0,(string *)local_350,&(this->_config).maxTOCSections
                     ,in_R8);
          poVar7 = ::std::operator<<((ostream *)local_660,(string *)&local_680);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::string::~string((string *)&local_680);
          ::std::__cxx11::string::~string(local_6a0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_6c8);
          ::std::__cxx11::string::~string((string *)&local_6c8);
          this_local._7_1_ = false;
          ::std::__cxx11::ostringstream::~ostringstream(local_660);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_4c8);
        poVar7 = ::std::operator<<((ostream *)local_4c8,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReadTOC");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x187f);
        ::std::operator<<(poVar7," ");
        poVar7 = ::std::operator<<((ostream *)local_4c8,"Failed to read TOC(# of sections).");
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_4e8);
        ::std::__cxx11::string::~string((string *)&local_4e8);
        ::std::__cxx11::ostringstream::~ostringstream(local_4c8);
        this_local._7_1_ = false;
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_328);
      poVar7 = ::std::operator<<((ostream *)local_328,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReadTOC");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1878);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)local_328,"Failed to move to TOC offset.");
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)&num_sections);
      ::std::__cxx11::string::~string((string *)&num_sections);
      ::std::__cxx11::ostringstream::~ostringstream(local_328);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CrateReader::ReadTOC() {

  DCOUT(fmt::format("Memory budget: {} bytes", _config.maxMemoryBudget));

  if ((_toc_offset <= 88) || (_toc_offset >= int64_t(_sr->size()))) {
    PUSH_ERROR("Invalid toc offset.");
    return false;
  }

  if (!_sr->seek_set(uint64_t(_toc_offset))) {
    PUSH_ERROR("Failed to move to TOC offset.");
    return false;
  }

  // read # of sections.
  uint64_t num_sections{0};
  if (!_sr->read8(&num_sections)) {
    PUSH_ERROR("Failed to read TOC(# of sections).");
    return false;
  }
  if (num_sections >= _config.maxTOCSections) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("# of sections {} are too large. maxTOCSections is set to {}", num_sections, _config.maxTOCSections));
  }

  DCOUT("toc sections = " << num_sections);

  _toc.sections.resize(static_cast<size_t>(num_sections));

  CHECK_MEMORY_USAGE(num_sections * sizeof(Section));

  for (size_t i = 0; i < num_sections; i++) {
    if (!ReadSection(&_toc.sections[i])) {
      PUSH_ERROR("Failed to read TOC section at " + std::to_string(i));
      return false;
    }
    DCOUT("section[" << i << "] name = " << _toc.sections[i].name
                     << ", start = " << _toc.sections[i].start
                     << ", size = " << _toc.sections[i].size);

    if (_toc.sections[i].start < 0) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Invalid section start byte offset."));
    }

    if (_toc.sections[i].size <= 0) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Invalid or empty section size."));
    }

    if (size_t(_toc.sections[i].size) > _sr->size()) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Section size exceeds input USDC data size."));
    }

    if (size_t(_toc.sections[i].start) > _sr->size()) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Section start byte offset exceeds input USDC data size."));
    }

    // TODO: handle integer overflow.
    size_t end_offset = size_t(_toc.sections[i].start + _toc.sections[i].size);
    if (sizeof(void *) == 4) { // 32bit
      if (end_offset > size_t(std::numeric_limits<int32_t>::max())) {
        PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Section end offset exceeds 32bit max."));
      }
    }
    if (end_offset > _sr->size()) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Section byte offset + size exceeds input USDC data size."));
    }


    if (0 == strncmp(_toc.sections[i].name, "TOKENS",
                     crate::kSectionNameMaxLength)) {
      _tokens_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "STRINGS",
                            crate::kSectionNameMaxLength)) {
      _strings_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "FIELDS",
                            crate::kSectionNameMaxLength)) {
      _fields_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "FIELDSETS",
                            crate::kSectionNameMaxLength)) {
      _fieldsets_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "SPECS",
                            crate::kSectionNameMaxLength)) {
      _specs_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "PATHS",
                            crate::kSectionNameMaxLength)) {
      _paths_index = int64_t(i);
    }
  }

  DCOUT("TOC read success");
  return true;
}